

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  string *psVar2;
  stringstream *this;
  uchar value;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  string local_58;
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  this = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this);
  *(undefined8 *)(this + *(long *)(*(long *)(this + 0x10) + -0x18) + 0x18) = 0x11;
  if (str->_M_string_length != 0) {
    poVar6 = (ostream *)(this + 0x10);
    uVar4 = 0;
    do {
      bVar1 = (str->_M_dataplus)._M_p[uVar4];
      switch(bVar1) {
      case 8:
        lVar3 = 2;
        pcVar5 = "\\b";
        break;
      case 9:
        lVar3 = 2;
        pcVar5 = "\\t";
        break;
      case 10:
        lVar3 = 2;
        pcVar5 = "\\n";
        break;
      case 0xb:
switchD_00202496_caseD_b:
        if ('\x1f' < (char)bVar1) {
          lVar3 = 1;
          pcVar5 = (char *)&local_58;
          local_58._M_dataplus._M_p._0_1_ = bVar1;
          break;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\\u00",4);
        String::FormatByte_abi_cxx11_(&local_58,(String *)(ulong)bVar1,value);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,(char *)CONCAT71(local_58._M_dataplus._M_p._1_7_,
                                           (byte)local_58._M_dataplus._M_p),
                   local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p) !=
            &local_58.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_58._M_dataplus._M_p._1_7_,(byte)local_58._M_dataplus._M_p))
          ;
        }
        goto LAB_002025a0;
      case 0xc:
        lVar3 = 2;
        pcVar5 = "\\f";
        break;
      case 0xd:
        lVar3 = 2;
        pcVar5 = "\\r";
        break;
      default:
        if ((0x3a < bVar1 - 0x22) ||
           ((0x400000000002001U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0))
        goto switchD_00202496_caseD_b;
        local_58._M_dataplus._M_p._0_1_ = 0x5c;
        pcVar5 = (char *)&local_58;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,1);
        lVar3 = 1;
        local_58._M_dataplus._M_p._0_1_ = bVar1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar5,lVar3);
LAB_002025a0:
      uVar4 = uVar4 + 1;
    } while (uVar4 < str->_M_string_length);
  }
  psVar2 = local_38;
  StringStreamToString(local_38,(stringstream *)this);
  (**(code **)(*(long *)this + 8))(this);
  return psVar2;
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}